

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O2

void __thiscall QToolBar::initStyleOption(QToolBar *this,QStyleOptionToolBar *option)

{
  State *pSVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  QStyle *pQVar5;
  QMainWindow *mainWindow;
  QMainWindowLayout *this_00;
  
  if (option != (QStyleOptionToolBar *)0x0) {
    lVar2 = *(long *)&(this->super_QWidget).field_0x8;
    QStyleOption::initFrom(&option->super_QStyleOption,&this->super_QWidget);
    if (*(int *)(*(long *)&(this->super_QWidget).field_0x8 + 0x25c) == 1) {
      pSVar1 = &(option->super_QStyleOption).state;
      *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                super_QFlagsStorage<QStyle::StateFlag>.i =
           (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                 super_QFlagsStorage<QStyle::StateFlag>.i | 0x80;
    }
    pQVar5 = QWidget::style(&this->super_QWidget);
    iVar4 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x34,0,this);
    option->lineWidth = iVar4;
    bVar3 = QToolBarLayout::movable(*(QToolBarLayout **)(lVar2 + 0x278));
    (option->features).super_QFlagsStorageHelper<QStyleOptionToolBar::ToolBarFeature,_4>.
    super_QFlagsStorage<QStyleOptionToolBar::ToolBarFeature>.i = (uint)bVar3;
    option->toolBarArea = NoToolBarArea;
    mainWindow = QtPrivate::qobject_cast_helper<QMainWindow*,QObject>
                           (*(QObject **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10));
    if (mainWindow != (QMainWindow *)0x0) {
      this_00 = qt_mainwindow_layout(mainWindow);
      QMainWindowLayout::getStyleOptionInfo((QMainWindowLayout *)this_00,option,this);
      return;
    }
  }
  return;
}

Assistant:

void QToolBar::initStyleOption(QStyleOptionToolBar *option) const
{
    Q_D(const QToolBar);

    if (!option)
        return;

    option->initFrom(this);
    if (orientation() == Qt::Horizontal)
        option->state |= QStyle::State_Horizontal;
    option->lineWidth = style()->pixelMetric(QStyle::PM_ToolBarFrameWidth, nullptr, this);
    option->features = d->layout->movable()
                        ? QStyleOptionToolBar::Movable
                        : QStyleOptionToolBar::None;
    // if the tool bar is not in a QMainWindow, this will make the painting right
    option->toolBarArea = Qt::NoToolBarArea;

    // Add more styleoptions if the toolbar has been added to a mainwindow.
    QMainWindow *mainWindow = qobject_cast<QMainWindow *>(parentWidget());

    if (!mainWindow)
        return;

    QMainWindowLayout *layout = qt_mainwindow_layout(mainWindow);
    Q_ASSERT_X(layout != nullptr, "QToolBar::initStyleOption()",
               "QMainWindow->layout() != QMainWindowLayout");

    layout->getStyleOptionInfo(option, const_cast<QToolBar *>(this));
}